

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrappers.pb.cc
# Opt level: O3

void google::protobuf::Int64Value::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  ulong uVar1;
  
  if (from_msg == to_msg) {
    MergeImpl();
    return;
  }
  if (from_msg[1]._vptr_MessageLite != (_func_int **)0x0) {
    to_msg[1]._vptr_MessageLite = from_msg[1]._vptr_MessageLite;
  }
  uVar1 = (from_msg->_internal_metadata_).ptr_;
  if ((uVar1 & 1) == 0) {
    return;
  }
  internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
            (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar1 & 0xfffffffffffffffe) + 8));
  return;
}

Assistant:

void Int64Value::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<Int64Value*>(&to_msg);
  auto& from = static_cast<const Int64Value&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.Int64Value)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  if (from._internal_value() != 0) {
    _this->_impl_.value_ = from._impl_.value_;
  }
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}